

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O0

QByteArray * __thiscall QCryptographicHash::result(QCryptographicHash *this)

{
  long lVar1;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  resultView((QCryptographicHash *)in_RDI);
  QByteArrayView::toByteArray(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QCryptographicHash::result() const
{
    return resultView().toByteArray();
}